

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O1

string * __thiscall
tinyusdz::to_string_abi_cxx11_(string *__return_storage_ptr__,tinyusdz *this,APIName *name)

{
  char *pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  switch(*(undefined4 *)this) {
  case 0:
    pcVar1 = "MaterialBindingAPI";
    break;
  case 1:
    pcVar1 = "ConnectableAPI";
    break;
  case 2:
    pcVar1 = "CoordSysAPI";
    break;
  case 3:
    pcVar1 = "NodeDefAPI";
    break;
  case 4:
    pcVar1 = "CollectionAPI";
    break;
  case 5:
    pcVar1 = "GeomModelAPI";
    break;
  case 6:
    pcVar1 = "MotionAPI";
    break;
  case 7:
    pcVar1 = "PrimvarsAPI";
    break;
  case 8:
    pcVar1 = "VisibilityAPI";
    break;
  case 9:
    pcVar1 = "XformCommonAPI";
    break;
  case 10:
    pcVar1 = "LightAPI";
    break;
  case 0xb:
    pcVar1 = "LightListAPI";
    break;
  case 0xc:
    pcVar1 = "ListAPI";
    break;
  case 0xd:
    pcVar1 = "MeshLightAPI";
    break;
  case 0xe:
    pcVar1 = "ShapingAPI";
    break;
  case 0xf:
    pcVar1 = "ShadowAPI";
    break;
  case 0x10:
    pcVar1 = "VolumeLightAPI";
    break;
  case 0x11:
    pcVar1 = "SkelBindingAPI";
    break;
  case 0x12:
    pcVar1 = "Preliminary_AnchoringAPI";
    break;
  case 0x13:
    pcVar1 = "Preliminary_PhysicsColliderAPI";
    break;
  case 0x14:
    pcVar1 = "Preliminary_PhysicsMaterialAPI";
    break;
  case 0x15:
    pcVar1 = "Preliminary_PhysicsRigidBodyAPI";
    break;
  default:
    goto switchD_002eaaa1_default;
  }
  ::std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)pcVar1);
switchD_002eaaa1_default:
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const APISchemas::APIName &name) {
  std::string s;

  switch (name) {
    case APISchemas::APIName::VisibilityAPI: {
      s = "VisibilityAPI";
      break;
    }
    case APISchemas::APIName::XformCommonAPI: {
      s = "XformCommonAPI";
      break;
    }
    case APISchemas::APIName::SkelBindingAPI: {
      s = "SkelBindingAPI";
      break;
    }
    case APISchemas::APIName::MotionAPI: {
      s = "MotionAPI";
      break;
    }
    case APISchemas::APIName::PrimvarsAPI: {
      s = "PrimvarsAPI";
      break;
    }
    case APISchemas::APIName::CollectionAPI: {
      s = "CollectionAPI";
      break;
    }
    case APISchemas::APIName::ConnectableAPI: {
      s = "ConnectableAPI";
      break;
    }
    case APISchemas::APIName::CoordSysAPI: {
      s = "CoordSysAPI";
      break;
    }
    case APISchemas::APIName::NodeDefAPI: {
      s = "NodeDefAPI";
      break;
    }
    case APISchemas::APIName::MaterialBindingAPI: {
      s = "MaterialBindingAPI";
      break;
    }
    case APISchemas::APIName::ShapingAPI: {
      s = "ShapingAPI";
      break;
    }
    case APISchemas::APIName::ShadowAPI: {
      s = "ShadowAPI";
      break;
    }
    case APISchemas::APIName::GeomModelAPI: {
      s = "GeomModelAPI";
      break;
    }
    case APISchemas::APIName::ListAPI: {
      s = "ListAPI";
      break;
    }
    case APISchemas::APIName::LightAPI: {
      s = "LightAPI";
      break;
    }
    case APISchemas::APIName::LightListAPI: {
      s = "LightListAPI";
      break;
    }
    case APISchemas::APIName::VolumeLightAPI: {
      s = "VolumeLightAPI";
      break;
    }
    case APISchemas::APIName::MeshLightAPI: {
      s = "MeshLightAPI";
      break;
    }
    case APISchemas::APIName::Preliminary_AnchoringAPI: {
      s = "Preliminary_AnchoringAPI";
      break;
    }
    case APISchemas::APIName::Preliminary_PhysicsColliderAPI: {
      s = "Preliminary_PhysicsColliderAPI";
      break;
    }
    case APISchemas::APIName::Preliminary_PhysicsRigidBodyAPI: {
      s = "Preliminary_PhysicsRigidBodyAPI";
      break;
    }
    case APISchemas::APIName::Preliminary_PhysicsMaterialAPI: {
      s = "Preliminary_PhysicsMaterialAPI";
      break;
    }
  }

  return s;
}